

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * attribute_transparent_union(dmr_C *C,token *token,symbol *attr,decl_state *ctx)

{
  byte *pbVar1;
  symbol *psVar2;
  
  if (C->Wtransparent_union != 0) {
    dmrC_warning(C,token->pos,"attribute __transparent_union__");
  }
  psVar2 = (ctx->ctype).base_type;
  if ((psVar2 == (symbol *)0x0) || (*(char *)psVar2 != '\b')) {
    dmrC_warning(C,token->pos,"attribute __transparent_union__ applied to non-union type");
  }
  else {
    pbVar1 = (byte *)((long)&psVar2->field_14 + 0xf);
    *pbVar1 = *pbVar1 | 4;
  }
  return token;
}

Assistant:

static struct token *attribute_transparent_union(struct dmr_C *C, struct token *token, struct symbol *attr, struct decl_state *ctx)
{
        (void) attr;
	if (C->Wtransparent_union)
		dmrC_warning(C, token->pos, "attribute __transparent_union__");
	if (ctx->ctype.base_type && ctx->ctype.base_type->type == SYM_UNION)
		ctx->ctype.base_type->transparent_union = 1;
	else
		dmrC_warning(C, token->pos, "attribute __transparent_union__ applied to non-union type");
	return token;
}